

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

int lys_node_addchild(lys_node *parent,lys_module *module,lys_node *child)

{
  lys_node *plVar1;
  lys_module *plVar2;
  LYS_NODE LVar3;
  LY_STMT stmt;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  lys_node **pplVar7;
  lys_node *plVar8;
  char *pcVar9;
  lys_node *plVar10;
  LY_VLOG_ELEM elem_type;
  LYS_NODE LVar11;
  LYS_NODE LVar12;
  LY_ECODE code;
  bool bVar13;
  lyext_substmt *local_38;
  lyext_substmt *info;
  
  local_38 = (lyext_substmt *)0x0;
  if (child == (lys_node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x2be,
                  "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                 );
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x2c4,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
    LVar12 = child->nodetype;
    if ((LVar12 & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) {
      __assert_fail("!(child->nodetype & (LYS_INPUT | LYS_OUTPUT))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x2c5,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
LAB_001531e4:
    if ((LVar12 & 0xb9bf) == LYS_UNKNOWN) {
      pcVar6 = strnodetype(LVar12);
      pcVar9 = "(sub)module";
LAB_0015327f:
      code = LYE_INCHILDSTMT;
      elem_type = LY_VLOG_LYS;
LAB_001533c6:
      ly_vlog(code,elem_type,parent,pcVar6,pcVar9);
      return 1;
    }
    bVar13 = true;
    LVar12 = LYS_UNKNOWN;
  }
  else {
    LVar12 = parent->nodetype;
    module = parent->module;
    bVar13 = true;
    if ((int)LVar12 < 0x100) {
      if ((int)LVar12 < 0x10) {
        switch(LVar12) {
        case LYS_UNKNOWN:
          LVar12 = child->nodetype;
          goto LAB_001531e4;
        case LYS_CONTAINER:
switchD_001531c0_caseD_1:
          LVar11 = child->nodetype;
          LVar3 = LVar11 & 0xd8bf;
joined_r0x0015335d:
          if (LVar3 == LYS_UNKNOWN) {
            pcVar6 = strnodetype(LVar11);
            pcVar9 = strnodetype(parent->nodetype);
            code = LYE_INCHILDSTMT;
            elem_type = LY_VLOG_LYS;
            goto LAB_001533c6;
          }
          break;
        case LYS_CHOICE:
          LVar12 = child->nodetype;
          if ((LVar12 & 0x807f) == LYS_UNKNOWN) {
            pcVar6 = strnodetype(LVar12);
            pcVar9 = "choice";
            goto LAB_0015327f;
          }
          bVar13 = LVar12 == LYS_CASE;
          LVar12 = LYS_CHOICE;
          break;
        case LYS_LEAF:
        case LYS_LEAFLIST:
switchD_001531c0_caseD_4:
          pcVar9 = strnodetype(child->nodetype);
          pcVar6 = strnodetype(parent->nodetype);
          ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar9,pcVar6);
          pcVar9 = strnodetype(parent->nodetype);
          pcVar6 = "The \"%s\" statement cannot have any data substatement.";
          code = LYE_SPEC;
          elem_type = LY_VLOG_PREV;
          parent = (lys_node *)0x0;
          goto LAB_001533c6;
        }
      }
      else if ((int)LVar12 < 0x40) {
        if (LVar12 == LYS_LIST) goto switchD_001531c0_caseD_1;
        if (LVar12 == LYS_ANYXML) goto switchD_001531c0_caseD_4;
      }
      else if (LVar12 == LYS_CASE) {
        LVar12 = LYS_CASE;
        if ((child->nodetype & 0x903f) == LYS_UNKNOWN) {
          pcVar6 = strnodetype(child->nodetype);
          pcVar9 = "case";
          goto LAB_0015327f;
        }
      }
      else if (LVar12 == LYS_NOTIF) goto LAB_00153353;
    }
    else if ((int)LVar12 < 0x1000) {
      if ((int)LVar12 < 0x400) {
        if (LVar12 == LYS_RPC) goto LAB_001533d7;
        if (LVar12 == LYS_INPUT) goto LAB_00153353;
      }
      else {
        if (LVar12 == LYS_OUTPUT) {
LAB_00153353:
          LVar11 = child->nodetype;
          LVar3 = LVar11 & 0x983f;
          goto joined_r0x0015335d;
        }
        if (LVar12 == LYS_GROUPING) goto switchD_001531c0_caseD_1;
      }
    }
    else if ((int)LVar12 < 0x4000) {
      if (LVar12 == LYS_USES) goto switchD_001531c0_caseD_1;
      if (LVar12 == LYS_AUGMENT) {
        LVar11 = child->nodetype;
        LVar12 = LYS_AUGMENT;
        LVar3 = LVar11 & 0xd0ff;
        goto joined_r0x0015335d;
      }
    }
    else if (LVar12 == LYS_ACTION) {
LAB_001533d7:
      if ((child->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
        pcVar6 = strnodetype(child->nodetype);
        pcVar9 = "rpc";
        goto LAB_0015327f;
      }
    }
    else {
      if (LVar12 == LYS_ANYDATA) goto switchD_001531c0_caseD_4;
      if (LVar12 == LYS_EXT) {
        stmt = lys_snode2stmt(child->nodetype);
        pvVar5 = lys_ext_complex_get_substmt(stmt,(lys_ext_instance_complex *)parent,&local_38);
        LVar12 = LYS_EXT;
        if (pvVar5 == (void *)0x0) {
          pcVar6 = strnodetype(child->nodetype);
          pcVar9 = *(char **)parent->name;
          goto LAB_0015327f;
        }
      }
    }
  }
  iVar4 = lys_check_id(child,parent,module);
  if (iVar4 != 0) {
    return 1;
  }
  if (child->parent != (lys_node *)0x0) {
    lys_node_unlink(child);
  }
  LVar11 = child->nodetype;
  if (((LVar11 & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) || (parent->nodetype == LYS_EXT)) {
    if (bVar13) {
      if (parent == (lys_node *)0x0) {
        plVar8 = module->data;
        if (plVar8 == (lys_node *)0x0) {
          pplVar7 = &module->data;
        }
        else {
          plVar10 = plVar8->prev;
          pplVar7 = &plVar8->prev;
          plVar10->next = child;
          child->prev = plVar10;
        }
        *pplVar7 = child;
        bVar13 = true;
        plVar8 = (lys_node *)0x0;
        goto LAB_00153617;
      }
    }
    else {
      plVar8 = (lys_node *)calloc(1,0x70);
      pcVar9 = lydict_insert(module->ctx,child->name,0);
      plVar8->name = pcVar9;
      plVar8->flags = 0x40;
      plVar8->module = module;
      plVar8->nodetype = LYS_CASE;
      plVar8->prev = plVar8;
      lys_node_addchild(parent,module,plVar8);
      LVar11 = child->nodetype;
      parent = plVar8;
    }
    pplVar7 = lys_child(parent,LVar11);
    if (pplVar7 == (lys_node **)0x0) {
      __assert_fail("pchild",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x356,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
    plVar8 = *pplVar7;
    if (plVar8 == (lys_node *)0x0) {
      *pplVar7 = child;
      child->parent = parent;
      plVar8 = child;
      if (child->next != (lys_node *)0x0) {
        plVar10 = (lys_node *)0x0;
        plVar1 = child->next;
        goto LAB_0015355e;
      }
LAB_00153579:
      plVar10 = *pplVar7;
    }
    else {
      if (LVar12 == LYS_AUGMENT) {
        do {
          plVar8 = plVar8->prev;
        } while (plVar8->parent != parent);
        plVar10 = plVar8->next;
      }
      else {
        plVar8 = plVar8->prev;
        plVar10 = (lys_node *)0x0;
      }
      plVar8->next = child;
      child->prev = plVar8;
      plVar1 = child;
LAB_0015355e:
      do {
        plVar8 = plVar1;
        plVar8->parent = parent;
        plVar1 = plVar8->next;
      } while (plVar8->next != (lys_node *)0x0);
      if (plVar10 == (lys_node *)0x0) goto LAB_00153579;
      plVar8->next = plVar10;
    }
    plVar10->prev = plVar8;
    plVar8 = parent;
  }
  else {
    plVar8 = parent->child;
    if (LVar11 == LYS_OUTPUT) {
      plVar10 = plVar8;
      plVar8 = plVar8->next;
    }
    else {
      parent->child = child;
      plVar10 = child;
    }
    plVar1 = plVar8->next;
    if (plVar1 == (lys_node *)0x0) {
      plVar10->prev = child;
    }
    else {
      child->next = plVar1;
      plVar1->prev = child;
      plVar8->next = (lys_node *)0x0;
    }
    plVar10 = plVar8->prev;
    child->prev = plVar10;
    if (plVar10->next != (lys_node *)0x0) {
      plVar10->next = child;
    }
    plVar8->prev = plVar8;
    child->parent = parent;
    plVar8->parent = (lys_node *)0x0;
    lys_node_free(plVar8,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
    plVar8 = parent;
  }
  do {
    if ((parent->nodetype & (LYS_EXT|LYS_AUGMENT|LYS_GROUPING)) != LYS_UNKNOWN) goto LAB_00153615;
    parent = parent->parent;
    plVar10 = child;
  } while (parent != (lys_node *)0x0);
  do {
    if ((plVar10->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN)
    goto LAB_00153615;
    pplVar7 = &plVar10->parent;
    plVar10 = *pplVar7;
  } while (*pplVar7 != (lys_node *)0x0);
  if (((plVar8->flags & 2) != 0) && ((child->flags & 1) != 0)) {
    ly_vlog(LYE_INARG,LY_VLOG_LYS,child,"true","config");
    ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
            "State nodes cannot have configuration nodes as children.");
    return 1;
  }
LAB_00153615:
  bVar13 = false;
LAB_00153617:
  LVar12 = child->nodetype;
  if (((LVar12 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
       LYS_UNKNOWN) && ((child->flags & 0x80) != 0 && !bVar13)) {
    do {
      if ((plVar8->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
        if ((char)plVar8->flags < '\0') break;
        plVar8->flags = plVar8->flags | 0x80;
      }
      if (plVar8->nodetype == LYS_EXT) {
        if (plVar8->padding[1] != '\x01') break;
        plVar8 = (lys_node *)plVar8->dsc;
      }
      else {
        plVar8 = plVar8->parent;
        if (plVar8 == (lys_node *)0x0) break;
      }
      if (plVar8->nodetype == LYS_AUGMENT) {
        plVar8 = plVar8->prev;
      }
    } while (plVar8 != (lys_node *)0x0);
  }
  if ((LVar12 & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
    plVar8 = (lys_node *)calloc(1,0x78);
    plVar8->nodetype = LYS_INPUT;
    pcVar9 = lydict_insert(child->module->ctx,"input",5);
    plVar8->name = pcVar9;
    plVar10 = (lys_node *)calloc(1,0x78);
    pcVar9 = lydict_insert(child->module->ctx,"output",6);
    plVar10->name = pcVar9;
    plVar10->nodetype = LYS_OUTPUT;
    plVar2 = child->module;
    plVar10->module = plVar2;
    plVar8->module = plVar2;
    plVar10->parent = child;
    plVar8->parent = child;
    plVar10->flags = 0x40;
    plVar8->flags = 0x40;
    plVar8->next = plVar10;
    plVar8->prev = plVar10;
    plVar10->prev = plVar8;
    child->child = plVar8;
    return 0;
  }
  return 0;
}

Assistant:

int
lys_node_addchild(struct lys_node *parent, struct lys_module *module, struct lys_node *child)
{
    struct lys_node *iter, *next, **pchild;
    struct lys_node_inout *in, *out, *inout;
    struct lys_node_case *c;
    int type, shortcase = 0;
    void *p;
    struct lyext_substmt *info = NULL;

    assert(child);

    if (parent) {
        type = parent->nodetype;
        module = parent->module;
    } else {
        assert(module);
        assert(!(child->nodetype & (LYS_INPUT | LYS_OUTPUT)));
        type = 0;
    }

    /* checks */
    switch (type) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
    case LYS_USES:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_CHOICE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "choice");
            return EXIT_FAILURE;
        }
        if (child->nodetype != LYS_CASE) {
            shortcase = 1;
        }
        break;
    case LYS_CASE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "case");
            return EXIT_FAILURE;
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (!(child->nodetype & (LYS_INPUT | LYS_OUTPUT | LYS_GROUPING))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "rpc");
            return EXIT_FAILURE;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
        LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "The \"%s\" statement cannot have any data substatement.",
               strnodetype(parent->nodetype));
        return EXIT_FAILURE;
    case LYS_AUGMENT:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_UNKNOWN:
        /* top level */
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_GROUPING
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_RPC | LYS_NOTIF | LYS_AUGMENT))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "(sub)module");
            return EXIT_FAILURE;
        }
        break;
    case LYS_EXT:
        /* plugin-defined */
        p = lys_ext_complex_get_substmt(lys_snode2stmt(child->nodetype), (struct lys_ext_instance_complex*)parent, &info);
        if (!p) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype),
                   ((struct lys_ext_instance_complex*)parent)->def->name);
            return EXIT_FAILURE;
        }
        /* TODO check cardinality */
        break;
    }

    /* check identifier uniqueness */
    if (lys_check_id(child, parent, module)) {
        return EXIT_FAILURE;
    }

    if (child->parent) {
        lys_node_unlink(child);
    }

    if ((child->nodetype & (LYS_INPUT | LYS_OUTPUT)) && parent->nodetype != LYS_EXT) {
        /* replace the implicit input/output node */
        if (child->nodetype == LYS_OUTPUT) {
            inout = (struct lys_node_inout *)parent->child->next;
        } else { /* LYS_INPUT */
            inout = (struct lys_node_inout *)parent->child;
            parent->child = child;
        }
        if (inout->next) {
            child->next = inout->next;
            inout->next->prev = child;
            inout->next = NULL;
        } else {
            parent->child->prev = child;
        }
        child->prev = inout->prev;
        if (inout->prev->next) {
            inout->prev->next = child;
        }
        inout->prev = (struct lys_node *)inout;
        child->parent = parent;
        inout->parent = NULL;
        lys_node_free((struct lys_node *)inout, NULL, 0);
    } else {
        if (shortcase) {
            /* create the implicit case to allow it to serve as a target of the augments,
             * it won't be printed, but it will be present in the tree */
            c = calloc(1, sizeof *c);
            c->name = lydict_insert(module->ctx, child->name, 0);
            c->flags = LYS_IMPLICIT;
            c->module = module;
            c->nodetype = LYS_CASE;
            c->prev = (struct lys_node*)c;
            lys_node_addchild(parent, module, (struct lys_node*)c);
            parent = (struct lys_node*)c;
        }
        /* connect the child correctly */
        if (!parent) {
            if (module->data) {
                module->data->prev->next = child;
                child->prev = module->data->prev;
                module->data->prev = child;
            } else {
                module->data = child;
            }
        } else {
            next = NULL;
            pchild = lys_child(parent, child->nodetype);
            assert(pchild);

            if (!(*pchild)) {
                /* the only/first child of the parent */
                *pchild = child;
                child->parent = parent;
                iter = child;
            } else if (type == LYS_AUGMENT) {
                /* add a new child as a last child of the augment (no matter if applied or not) */
                for (iter = (*pchild)->prev; iter->parent != parent; iter = iter->prev);
                next = iter->next;
                iter->next = child;
                child->prev = iter;
            } else {
                /* add a new child at the end of parent's child list */
                iter = (*pchild)->prev;
                iter->next = child;
                child->prev = iter;
            }
            while (iter->next) {
                iter = iter->next;
                iter->parent = parent;
            }
            if (next) {
                /* we are in applied augment, its target has some additional nodes after the nodes from this augment */
                iter->next = next;
                next->prev = iter;
            } else {
                (*pchild)->prev = iter;
            }
        }
    }

    /* check config value (but ignore them in groupings and augments) */
    for (iter = parent; iter && !(iter->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); iter = iter->parent);
    if (parent && !iter) {
        for (iter = child; iter && !(iter->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); iter = iter->parent);
        if (!iter && (parent->flags & LYS_CONFIG_R) && (child->flags & LYS_CONFIG_W)) {
            LOGVAL(LYE_INARG, LY_VLOG_LYS, child, "true", "config");
            LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
            return EXIT_FAILURE;
        }
    }

    /* propagate information about status data presence */
    if ((child->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) &&
            (child->flags & LYS_INCL_STATUS)) {
        for(iter = parent; iter; iter = lys_parent(iter)) {
            /* store it only into container or list - the only data inner nodes */
            if (iter->nodetype & (LYS_CONTAINER | LYS_LIST)) {
                if (iter->flags & LYS_INCL_STATUS) {
                    /* done, someone else set it already from here */
                    break;
                }
                /* set flag about including status data */
                iter->flags |= LYS_INCL_STATUS;
            }
        }
    }

    /* create implicit input/output nodes to have available them as possible target for augment */
    if (child->nodetype & (LYS_RPC | LYS_ACTION)) {
        in = calloc(1, sizeof *in);
        in->nodetype = LYS_INPUT;
        in->name = lydict_insert(child->module->ctx, "input", 5);
        out = calloc(1, sizeof *out);
        out->name = lydict_insert(child->module->ctx, "output", 6);
        out->nodetype = LYS_OUTPUT;
        in->module = out->module = child->module;
        in->parent = out->parent = child;
        in->flags = out->flags = LYS_IMPLICIT;
        in->next = (struct lys_node *)out;
        in->prev = (struct lys_node *)out;
        out->prev = (struct lys_node *)in;
        child->child = (struct lys_node *)in;
    }
    return EXIT_SUCCESS;
}